

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O0

float __thiscall w3Module::read_f32(w3Module *this,uint8_t **cursor)

{
  uint8_t uVar1;
  uint local_20;
  float local_1c;
  uint32_t i;
  anon_union_4_2_095b825b u;
  uint8_t **cursor_local;
  w3Module *this_local;
  
  _i = cursor;
  cursor_local = (uint8_t **)this;
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    uVar1 = read_byte(this,_i);
    *(uint8_t *)((long)&local_1c + (ulong)local_20) = uVar1;
  }
  return local_1c;
}

Assistant:

float w3Module::read_f32 (uint8_t** cursor)
// floats are not variably sized? Spec is unclear due to fancy notation
// getting in the way.
{
    union {
        uint8_t bytes [4];
        float f32;
    } u;
    for (uint32_t i = 0; i < 4; ++i)
        u.bytes [i] = (uint8_t)read_byte (cursor);
    return u.f32;
}